

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

istream * serialize::read<std::__cxx11::string,std::__cxx11::string>
                    (istream *istream_,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *container)

{
  mapped_type *pmVar1;
  size_t extraout_RDX;
  size_t __nbytes;
  size_t __nbytes_00;
  size_t extraout_RDX_00;
  int i;
  int iVar2;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  int local_34 [2];
  int size;
  
  if (*(int *)(istream_ + *(long *)(*(long *)istream_ + -0x18) + 0x20) == 0) {
    value.field_2._8_8_ = container;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&container->_M_t);
    read<int>(istream_,local_34);
    __nbytes = extraout_RDX;
    for (iVar2 = 0; iVar2 < local_34[0]; iVar2 = iVar2 + 1) {
      local_80 = (undefined1  [8])&key._M_string_length;
      key._M_dataplus._M_p = (pointer)0x0;
      key._M_string_length._0_1_ = 0;
      key.field_2._8_8_ = &value._M_string_length;
      value._M_dataplus._M_p = (pointer)0x0;
      value._M_string_length._0_1_ = 0;
      read((int)istream_,(key_type *)local_80,__nbytes);
      read((int)istream_,(string *)(key.field_2._M_local_buf + 8),__nbytes_00);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)value.field_2._8_8_,(key_type *)local_80);
      std::__cxx11::string::_M_assign((string *)pmVar1);
      std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_80);
      __nbytes = extraout_RDX_00;
    }
  }
  return istream_;
}

Assistant:

static inline  istream& read(istream& istream_, map<K, V>& container)
{
	if (!istream_.good() || istream_.eof())return istream_;
	int size;
	container.clear();
	read(istream_, size);

	for (int i = 0; i < size; ++i)
	{
		K key;
		V value;
		read(istream_, key);

		read(istream_, value);
		container[key] = value;

	}
	return istream_;
}